

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.h
# Opt level: O0

CordzInfo * __thiscall absl::lts_20240722::cord_internal::InlineData::cordz_info(InlineData *this)

{
  bool bVar1;
  uint64_t uVar2;
  intptr_t info;
  InlineData *this_local;
  
  bVar1 = is_tree(this);
  if (!bVar1) {
    __assert_fail("is_tree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/strings/internal/cord_internal.h"
                  ,0x240,"CordzInfo *absl::cord_internal::InlineData::cordz_info() const");
  }
  uVar2 = Rep::cordz_info(&this->rep_);
  uVar2 = little_endian::ToHost64(uVar2);
  if ((uVar2 & 1) != 0) {
    return (CordzInfo *)(uVar2 - 1);
  }
  __assert_fail("info & 1",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/strings/internal/cord_internal.h"
                ,0x243,"CordzInfo *absl::cord_internal::InlineData::cordz_info() const");
}

Assistant:

CordzInfo* cordz_info() const {
    assert(is_tree());
    intptr_t info = static_cast<intptr_t>(absl::little_endian::ToHost64(
        static_cast<uint64_t>(rep_.cordz_info())));
    assert(info & 1);
    return reinterpret_cast<CordzInfo*>(info - 1);
  }